

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpClientImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::HttpClientImpl> *this,void *pointer)

{
  PromiseArenaMember *pPVar1;
  long *plVar2;
  
  if (pointer != (void *)0x0) {
    if ((*(char *)((long)pointer + 0x160) == '\x01') &&
       (pPVar1 = *(PromiseArenaMember **)((long)pointer + 0x168),
       pPVar1 != (PromiseArenaMember *)0x0)) {
      *(undefined8 *)((long)pointer + 0x168) = 0;
      PromiseDisposer::dispose(pPVar1);
    }
    plVar2 = *(long **)((long)pointer + 0x128);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x128) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x120))
                (*(undefined8 **)((long)pointer + 0x120),(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pPVar1 = *(PromiseArenaMember **)((long)pointer + 0x110);
    if (pPVar1 != (PromiseArenaMember *)0x0) {
      *(undefined8 *)((long)pointer + 0x110) = 0;
      PromiseDisposer::dispose(pPVar1);
    }
    anon_unknown_36::WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>::
    ~WrappableStreamMixin
              (*(WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream> **)
                ((long)pointer + 0x100));
    anon_unknown_36::HttpInputStreamImpl::~HttpInputStreamImpl
              ((HttpInputStreamImpl *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x178);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }